

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::permissions(path *p,perms prms,perm_options opts,error_code *ec)

{
  EnableBitmask<ghc::filesystem::perm_options> EVar1;
  perms pVar2;
  perms X;
  EnableBitmask<ghc::filesystem::perms> Y;
  int iVar3;
  value_type *__file;
  error_code eVar4;
  undefined4 uStack_54;
  file_status local_38;
  file_status fs;
  error_code *ec_local;
  perm_options opts_local;
  perms prms_local;
  path *p_local;
  
  EVar1 = operator|(replace,add);
  EVar1 = operator|(EVar1,remove);
  EVar1 = operator&(opts,EVar1);
  if (EVar1 == 0) {
    eVar4 = detail::make_error_code(invalid_argument);
    *(ulong *)ec = CONCAT44(fs._4_4_,eVar4._M_value);
    ec->_M_cat = eVar4._M_cat;
  }
  else {
    symlink_status((filesystem *)&local_38,p,ec);
    EVar1 = operator&(opts,replace);
    ec_local._6_2_ = prms;
    if (EVar1 != replace) {
      pVar2 = others_exec;
      EVar1 = operator&(opts,add);
      if (EVar1 == add) {
        pVar2 = file_status::permissions(&local_38);
        ec_local._6_2_ = operator|(pVar2,prms);
      }
      else {
        X = file_status::permissions(&local_38);
        Y = operator~((filesystem *)(ulong)prms,pVar2);
        ec_local._6_2_ = operator&(X,Y);
      }
    }
    EVar1 = operator&(opts,nofollow);
    if (EVar1 != nofollow) {
      __file = path::c_str(p);
      iVar3 = chmod(__file,(uint)ec_local._6_2_);
      if (iVar3 != 0) {
        eVar4 = detail::make_system_error(0);
        *(ulong *)ec = CONCAT44(uStack_54,eVar4._M_value);
        ec->_M_cat = eVar4._M_cat;
      }
    }
    file_status::~file_status(&local_38);
  }
  return;
}

Assistant:

GHC_INLINE void permissions(const path& p, perms prms, perm_options opts, std::error_code& ec)
{
    if (static_cast<int>(opts & (perm_options::replace | perm_options::add | perm_options::remove)) == 0) {
        ec = detail::make_error_code(detail::portable_error::invalid_argument);
        return;
    }
    auto fs = symlink_status(p, ec);
    if ((opts & perm_options::replace) != perm_options::replace) {
        if ((opts & perm_options::add) == perm_options::add) {
            prms = fs.permissions() | prms;
        }
        else {
            prms = fs.permissions() & ~prms;
        }
    }
#ifdef GHC_OS_WINDOWS
#ifdef __GNUC__
    auto oldAttr = GetFileAttributesW(p.wstring().c_str());
    if (oldAttr != INVALID_FILE_ATTRIBUTES) {
        DWORD newAttr = ((prms & perms::owner_write) == perms::owner_write) ? oldAttr & ~(static_cast<DWORD>(FILE_ATTRIBUTE_READONLY)) : oldAttr | FILE_ATTRIBUTE_READONLY;
        if (oldAttr == newAttr || SetFileAttributesW(p.wstring().c_str(), newAttr)) {
            return;
        }
    }
    ec = detail::make_system_error();
#else
    int mode = 0;
    if ((prms & perms::owner_read) == perms::owner_read) {
        mode |= _S_IREAD;
    }
    if ((prms & perms::owner_write) == perms::owner_write) {
        mode |= _S_IWRITE;
    }
    if (::_wchmod(p.wstring().c_str(), mode) != 0) {
        ec = detail::make_system_error();
    }
#endif
#else
    if ((opts & perm_options::nofollow) != perm_options::nofollow) {
        if (::chmod(p.c_str(), static_cast<mode_t>(prms)) != 0) {
            ec = detail::make_system_error();
        }
    }
#endif
}